

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int xmlParseLookupGt(xmlParserCtxtPtr ctxt)

{
  xmlChar *pxVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  
  pxVar1 = ctxt->input->cur;
  pbVar2 = ctxt->input->end;
  uVar6 = ctxt->endCheckState;
  pbVar4 = pxVar1 + ctxt->checkIndex + (ulong)(ctxt->checkIndex == 0);
  pbVar3 = pbVar4;
  do {
    if (pbVar2 <= pbVar4) {
      lVar5 = (long)pbVar3 - (long)pxVar1;
      lVar7 = 0;
      if (0 < lVar5) {
        lVar7 = lVar5;
      }
      if (lVar5 < 0) {
        uVar6 = 0;
      }
      uVar8 = (uint)((ulong)lVar5 >> 0x3f);
LAB_00144c3a:
      ctxt->checkIndex = lVar7;
      ctxt->endCheckState = uVar6;
      return uVar8;
    }
    if (uVar6 == 0) {
      uVar8 = (uint)*pbVar4;
      uVar6 = uVar8;
      if (((uVar8 != 0x22) && (uVar8 != 0x27)) && (uVar6 = 0, uVar8 == 0x3e)) {
        uVar8 = 1;
        lVar7 = 0;
        uVar6 = 0;
        goto LAB_00144c3a;
      }
    }
    else if (uVar6 == *pbVar4) {
      uVar6 = 0;
    }
    pbVar4 = pbVar4 + 1;
    pbVar3 = pbVar2;
  } while( true );
}

Assistant:

static int
xmlParseLookupGt(xmlParserCtxtPtr ctxt) {
    const xmlChar *cur;
    const xmlChar *end = ctxt->input->end;
    int state = ctxt->endCheckState;
    size_t index;

    if (ctxt->checkIndex == 0)
        cur = ctxt->input->cur + 1;
    else
        cur = ctxt->input->cur + ctxt->checkIndex;

    while (cur < end) {
        if (state) {
            if (*cur == state)
                state = 0;
        } else if (*cur == '\'' || *cur == '"') {
            state = *cur;
        } else if (*cur == '>') {
            ctxt->checkIndex = 0;
            ctxt->endCheckState = 0;
            return(1);
        }
        cur++;
    }

    index = cur - ctxt->input->cur;
    if (index > LONG_MAX) {
        ctxt->checkIndex = 0;
        ctxt->endCheckState = 0;
        return(1);
    }
    ctxt->checkIndex = index;
    ctxt->endCheckState = state;
    return(0);
}